

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result wabt::ApplyNames(Module *module)

{
  Func *func;
  pointer pTVar1;
  pointer pTVar2;
  pointer ppGVar3;
  Export *pEVar4;
  pointer ppEVar5;
  pointer piVar6;
  pointer ppDVar7;
  DataSegment *pDVar8;
  pointer ppVVar9;
  Result RVar10;
  Index IVar11;
  pointer ppFVar12;
  pointer ppTVar13;
  pointer ppEVar14;
  ulong uVar15;
  ulong uVar16;
  ElemSegment *pEVar17;
  Enum EVar18;
  ulong uVar19;
  pointer piVar20;
  bool bVar21;
  bool bVar22;
  NameApplier applier;
  NameApplier local_e0;
  
  local_e0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_00226cf0;
  local_e0.module_ = (Module *)0x0;
  local_e0.current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(&local_e0.visitor_,(Delegate *)&local_e0);
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar12 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_e0.module_ = module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar12) {
    bVar21 = true;
    uVar16 = 0;
    do {
      func = ppFVar12[uVar16];
      local_e0.current_func_ = func;
      if (((func->decl).has_func_type == true) &&
         (RVar10 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                             (&local_e0,&(func->decl).type_var), RVar10.enum_ == Error)) {
LAB_00133b6d:
        EVar18 = Error;
        if (bVar21) goto LAB_00133f05;
        break;
      }
      pTVar1 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar11 = LocalTypes::size(&func->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3) + IVar11),&func->bindings,
                 &local_e0.param_and_local_index_to_name_);
      RVar10 = ExprVisitor::VisitFunc(&local_e0.visitor_,func);
      if (RVar10.enum_ == Error) goto LAB_00133b6d;
      local_e0.current_func_ = (Func *)0x0;
      uVar16 = uVar16 + 1;
      ppFVar12 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar21 = uVar16 < (ulong)((long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar12 >>
                               3);
    } while (bVar21);
  }
  ppGVar3 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar3) {
    RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&(*ppGVar3)->init_expr);
    EVar18 = Error;
    if (RVar10.enum_ == Error) goto LAB_00133f05;
    uVar16 = 1;
    do {
      uVar15 = uVar16;
      ppGVar3 = (module->globals).
                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = (long)(module->globals).
                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3;
      if (uVar19 <= uVar15) goto LAB_00133bf1;
      RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&ppGVar3[uVar15]->init_expr);
      uVar16 = uVar15 + 1;
    } while (RVar10.enum_ != Error);
    if (uVar15 < uVar19) goto LAB_00133f05;
  }
LAB_00133bf1:
  ppTVar13 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar21 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
           super__Vector_impl_data._M_finish != ppTVar13;
  if (bVar21) {
    uVar16 = 0;
    do {
      if (((ppTVar13[uVar16]->decl).has_func_type == true) &&
         (RVar10 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                             (&local_e0,&(ppTVar13[uVar16]->decl).type_var), RVar10.enum_ == Error))
      {
        EVar18 = Error;
        if (bVar21) goto LAB_00133f05;
        break;
      }
      uVar16 = uVar16 + 1;
      ppTVar13 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar21 = uVar16 < (ulong)((long)(module->tags).
                                      super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar13 >>
                               3);
    } while (bVar21);
  }
  ppEVar14 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar14) {
    uVar16 = 0;
    do {
      pEVar4 = ppEVar14[uVar16];
      switch(pEVar4->kind) {
      case First:
        anon_unknown_11::NameApplier::UseNameForFuncVar(&local_e0,&pEVar4->var);
        break;
      case Table:
        anon_unknown_11::NameApplier::UseNameForTableVar(&local_e0,&pEVar4->var);
        break;
      case Memory:
        anon_unknown_11::NameApplier::UseNameForMemoryVar(&local_e0,&pEVar4->var);
        break;
      case Global:
        anon_unknown_11::NameApplier::UseNameForGlobalVar(&local_e0,&pEVar4->var);
        break;
      case Last:
        anon_unknown_11::NameApplier::UseNameForTagVar(&local_e0,&pEVar4->var);
      }
      uVar16 = uVar16 + 1;
      ppEVar14 = (module->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(module->exports).
                                    super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar14 >> 3
                             ));
  }
  ppEVar5 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar5) {
    pEVar17 = *ppEVar5;
    RVar10 = anon_unknown_11::NameApplier::UseNameForTableVar(&local_e0,&pEVar17->table_var);
    EVar18 = Error;
    if ((RVar10.enum_ != Error) &&
       (RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&pEVar17->offset),
       RVar10.enum_ != Error)) {
      bVar21 = true;
      uVar16 = 0;
      do {
        piVar6 = (pEVar17->elem_exprs).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (piVar20 = (pEVar17->elem_exprs).
                       super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; bVar22 = piVar20 != piVar6, bVar22
            ; piVar20 = piVar20 + 1) {
          if (piVar20->size_ == 0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                          ,0x183,
                          "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::front() [T = wabt::Expr]"
                         );
          }
          if ((piVar20->first_->type_ == RefFunc) &&
             (RVar10 = anon_unknown_11::NameApplier::UseNameForFuncVar
                                 (&local_e0,(Var *)(piVar20->first_ + 1)), RVar10.enum_ == Error))
          break;
        }
        EVar18 = Error;
        if (bVar22) goto LAB_00133ddc;
        uVar16 = uVar16 + 1;
        ppEVar5 = (module->elem_segments).
                  super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar21 = uVar16 < (ulong)((long)(module->elem_segments).
                                        super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5
                                 >> 3);
        if (!bVar21) goto LAB_00133de7;
        pEVar17 = ppEVar5[uVar16];
        RVar10 = anon_unknown_11::NameApplier::UseNameForTableVar(&local_e0,&pEVar17->table_var);
        if ((RVar10.enum_ == Error) ||
           (RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&pEVar17->offset),
           RVar10.enum_ == Error)) goto LAB_00133ddc;
      } while( true );
    }
    goto LAB_00133f05;
  }
LAB_00133de7:
  ppDVar7 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar7) {
    pDVar8 = *ppDVar7;
    RVar10 = anon_unknown_11::NameApplier::UseNameForMemoryVar(&local_e0,&pDVar8->memory_var);
    EVar18 = Error;
    if ((RVar10.enum_ == Error) ||
       (RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&pDVar8->offset),
       RVar10.enum_ == Error)) goto LAB_00133f05;
    uVar16 = 1;
    do {
      uVar15 = uVar16;
      ppDVar7 = (module->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar19 = (long)(module->data_segments).
                     super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar7 >> 3;
      if (uVar19 <= uVar15) goto LAB_00133e90;
      pDVar8 = ppDVar7[uVar15];
      RVar10 = anon_unknown_11::NameApplier::UseNameForMemoryVar(&local_e0,&pDVar8->memory_var);
      if (RVar10.enum_ == Error) break;
      RVar10 = ExprVisitor::VisitExprList(&local_e0.visitor_,&pDVar8->offset);
      uVar16 = uVar15 + 1;
    } while (RVar10.enum_ != Error);
    if (uVar15 < uVar19) goto LAB_00133f05;
  }
LAB_00133e90:
  ppVVar9 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar21 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
           super__Vector_impl_data._M_finish != ppVVar9;
  if (bVar21) {
    RVar10 = anon_unknown_11::NameApplier::UseNameForFuncVar(&local_e0,*ppVVar9);
    if (RVar10.enum_ != Error) {
      uVar16 = 1;
      do {
        ppVVar9 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar21 = uVar16 < (ulong)((long)(module->starts).
                                        super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar9
                                 >> 3);
        if (!bVar21) goto LAB_00133efa;
        RVar10 = anon_unknown_11::NameApplier::UseNameForFuncVar(&local_e0,ppVVar9[uVar16]);
        uVar16 = uVar16 + 1;
      } while (RVar10.enum_ != Error);
    }
    EVar18 = Error;
    if (bVar21) goto LAB_00133f05;
  }
LAB_00133efa:
  local_e0.module_ = (Module *)0x0;
  EVar18 = Ok;
LAB_00133f05:
  local_e0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_00226cf0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.labels_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.param_and_local_index_to_name_);
  if (local_e0.visitor_.catch_index_stack_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.catch_index_stack_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar18;
LAB_00133ddc:
  if (bVar21) goto LAB_00133f05;
  goto LAB_00133de7;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}